

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::load_model(ConvolutionDepthWise_x86 *this,ModelBin *mb)

{
  int iVar1;
  int iVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 uVar8;
  Layer *pLVar9;
  int iVar10;
  int i;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  Mat local_6e8;
  Allocator *local_6b0;
  size_t local_6a8;
  Mat weight_data_g;
  Mat bias_data_g;
  Mat weights [4];
  ParamDict pd;
  
  iVar7 = ConvolutionDepthWise::load_model(&this->super_ConvolutionDepthWise,mb);
  if (iVar7 == 0) {
    iVar7 = (this->super_ConvolutionDepthWise).num_output;
    iVar12 = (this->super_ConvolutionDepthWise).kernel_h *
             (this->super_ConvolutionDepthWise).kernel_w;
    iVar10 = (this->super_ConvolutionDepthWise).group;
    uVar5 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar10;
    uVar5 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / (long)iVar12;
    lVar11 = 0;
    while( true ) {
      ppLVar3 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((int)((ulong)((long)ppLVar4 - (long)ppLVar3) >> 3) <= lVar11) break;
      if (ppLVar3[lVar11] != (Layer *)0x0) {
        (*ppLVar3[lVar11]->_vptr_Layer[1])();
      }
      lVar11 = lVar11 + 1;
    }
    iVar10 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                  (long)(iVar7 / iVar10)) * iVar10;
    if (ppLVar4 != ppLVar3) {
      (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppLVar3;
    }
    iVar7 = (this->super_ConvolutionDepthWise).group;
    iVar13 = (this->super_ConvolutionDepthWise).num_output;
    if (((iVar10 == iVar7) &&
        (auVar6._4_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_w == 3),
        auVar6._0_4_ = -(uint)(iVar7 == iVar13),
        auVar6._8_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_h == 3),
        auVar6._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1),
        uVar8 = movmskps((int)ppLVar3,auVar6), (char)uVar8 == '\x0f')) &&
       ((this->super_ConvolutionDepthWise).dilation_h == 1)) {
      iVar1 = (this->super_ConvolutionDepthWise).stride_w;
      iVar2 = (this->super_ConvolutionDepthWise).stride_h;
      if (iVar2 == 1 && iVar1 == 1) {
        return 0;
      }
      if (iVar2 == 2 && iVar1 == 2) {
        return 0;
      }
    }
    iVar13 = iVar13 / iVar7;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(&this->group_ops,(long)iVar7)
    ;
    iVar7 = (iVar10 / iVar7) * iVar12 * iVar13;
    local_6a8 = (size_t)iVar7;
    local_6b0 = (Allocator *)(long)iVar13;
    for (lVar11 = 0; lVar11 < (this->super_ConvolutionDepthWise).group; lVar11 = lVar11 + 1) {
      weight_data_g.elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      weight_data_g.allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      weight_data_g.data =
           (void *)(lVar11 * local_6a8 * weight_data_g.elemsize +
                   (long)(this->super_ConvolutionDepthWise).weight_data.data);
      weight_data_g.refcount = (int *)0x0;
      weight_data_g.dims = 1;
      weight_data_g.w = (int)local_6a8;
      weight_data_g.h = 1;
      weight_data_g.c = 1;
      weight_data_g.cstep = local_6a8;
      bias_data_g.dims = 0;
      bias_data_g.w = 0;
      bias_data_g.h = 0;
      bias_data_g.c = 0;
      bias_data_g.cstep = 0;
      bias_data_g.elemsize = 0;
      bias_data_g.allocator = (Allocator *)0x0;
      bias_data_g.data = (void *)0x0;
      bias_data_g.refcount = (int *)0x0;
      if ((this->super_ConvolutionDepthWise).bias_term != 0) {
        pd.params[0]._0_8_ = (this->super_ConvolutionDepthWise).bias_data.elemsize;
        pd.params[0].v.data = (this->super_ConvolutionDepthWise).bias_data.allocator;
        pd._0_8_ = lVar11 * (long)local_6b0 * pd.params[0]._0_8_ +
                   (long)(this->super_ConvolutionDepthWise).bias_data.data;
        pd.use_int8_inference = 0;
        pd._12_4_ = 0;
        pd.params[0].v.refcount._0_4_ = 1;
        pd.params[0].v.elemsize = 0x100000001;
        pd.params[0].v.allocator = local_6b0;
        pd.params[0].v.refcount._4_4_ = iVar13;
        Mat::operator=(&bias_data_g,(Mat *)&pd);
        Mat::~Mat((Mat *)&pd);
      }
      pLVar9 = create_layer(6);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,iVar13);
      ParamDict::set(&pd,1,(this->super_ConvolutionDepthWise).kernel_w);
      ParamDict::set(&pd,0xb,(this->super_ConvolutionDepthWise).kernel_h);
      ParamDict::set(&pd,2,(this->super_ConvolutionDepthWise).dilation_w);
      ParamDict::set(&pd,0xc,(this->super_ConvolutionDepthWise).dilation_h);
      ParamDict::set(&pd,3,(this->super_ConvolutionDepthWise).stride_w);
      ParamDict::set(&pd,0xd,(this->super_ConvolutionDepthWise).stride_h);
      ParamDict::set(&pd,4,0);
      ParamDict::set(&pd,0xe,0);
      ParamDict::set(&pd,5,(this->super_ConvolutionDepthWise).bias_term);
      ParamDict::set(&pd,6,iVar7);
      ParamDict::set(&pd,8,(this->super_ConvolutionDepthWise).int8_scale_term);
      (*pLVar9->_vptr_Layer[2])(pLVar9);
      memset(weights,0,0xe0);
      Mat::operator=(weights,&weight_data_g);
      Mat::operator=(weights + 1,&bias_data_g);
      if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
        local_6e8.elemsize = (this->super_ConvolutionDepthWise).weight_data_int8_scales.elemsize;
        local_6e8.allocator = (this->super_ConvolutionDepthWise).weight_data_int8_scales.allocator;
        local_6e8.data =
             (void *)(local_6e8.elemsize * lVar11 +
                     (long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data);
        local_6e8.refcount = (int *)0x0;
        local_6e8.dims = 1;
        local_6e8.w = 1;
        local_6e8.h = 1;
        local_6e8.c = 1;
        local_6e8.cstep = 1;
        Mat::operator=(weights + 2,&local_6e8);
        Mat::~Mat(&local_6e8);
        local_6e8.elemsize = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
        local_6e8.allocator = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
        local_6e8.data =
             (void *)(local_6e8.elemsize * lVar11 +
                     (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
        local_6e8.refcount = (int *)0x0;
        local_6e8.dims = 1;
        local_6e8.w = 1;
        local_6e8.h = 1;
        local_6e8.c = 1;
        local_6e8.cstep = 1;
        Mat::operator=(weights + 3,&local_6e8);
        Mat::~Mat(&local_6e8);
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_6e8,weights);
      (*pLVar9->_vptr_Layer[3])(pLVar9,&local_6e8);
      (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar11] = pLVar9;
      lVar14 = 0xa8;
      do {
        Mat::~Mat((Mat *)((long)&weights[0].data + lVar14));
        lVar14 = lVar14 + -0x38;
      } while (lVar14 != -0x38);
      ParamDict::~ParamDict(&pd);
      Mat::~Mat(&bias_data_g);
      Mat::~Mat(&weight_data_g);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int ConvolutionDepthWise_x86::load_model(const ModelBin& mb)
{
    int ret = ConvolutionDepthWise::load_model(mb);
    if (ret != 0)
        return ret;

    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    if (channels == group && group == num_output)
    {
        // depth-wise specific
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
            {
                return 0;
            }
        }
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g=0; g<group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g);// weight_data_size
        pd.set(8, int8_scale_term);

        op->load_param(pd);

        // set weights
        ncnn::Mat weights[4];
        weights[0] = weight_data_g;
        weights[1] = bias_data_g;

        if (int8_scale_term)
        {
            weights[2] = weight_data_int8_scales.range(g, 1);
            weights[3] = bottom_blob_int8_scales.range(g, 1);
        }

        op->load_model(ModelBinFromMatArray(weights));

        group_ops[g] = op;
    }

    return 0;
}